

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O0

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRef requestOperation,QObject *context,
          QSlotObjectBase *rawSlot)

{
  long lVar1;
  QObject *in_RDI;
  long in_FS_OFFSET;
  SlotObjUniquePtr *in_stack_00000010;
  QObject *in_stack_00000018;
  QNetworkReply *reply;
  SlotObjUniquePtr slot;
  QNetworkReply *in_stack_00000098;
  QRestAccessManagerPrivate *in_stack_ffffffffffffff88;
  QNetworkReply *in_stack_ffffffffffffff90;
  QNetworkAccessManager *in_stack_ffffffffffffff98;
  QRestAccessManagerPrivate *in_stack_ffffffffffffffa8;
  QNetworkReply *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffff90,(pointer)in_stack_ffffffffffffff88);
  if (*(long *)(in_RDI + 0x80) == 0) {
    local_30 = warnNoAccessManager(in_stack_ffffffffffffff88);
  }
  else {
    verifyThreadAffinity(in_stack_ffffffffffffffa8,in_RDI);
    in_stack_ffffffffffffff90 =
         qxp::detail::function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>
         ::operator()((function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*>
                       *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff98);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff90,
               (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff88);
    local_30 = createActiveRequest((QRestAccessManagerPrivate *)reply,in_stack_00000098,
                                   in_stack_00000018,in_stack_00000010);
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               in_stack_ffffffffffffff90);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRef requestOperation,
                                  const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkReply *reply = requestOperation(qnam);
        return createActiveRequest(reply, context, std::move(slot));
    }